

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  undefined1 local_28 [8];
  Value temp;
  Value *other_local;
  Value *this_local;
  
  temp._8_8_ = other;
  Value((Value *)local_28,other);
  swap(this,(Value *)local_28);
  ~Value((Value *)local_28);
  return this;
}

Assistant:

Value&
Value::operator= ( const Value& other )
{
    Value temp ( other );
    swap ( temp );
    return *this;
}